

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

enable_if_t<std::is_same<PathData,_PathData>::value,_void> __thiscall
rlottie::internal::model::Property<rlottie::internal::model::PathData,_void>::
value<rlottie::internal::model::PathData>
          (Property<rlottie::internal::model::PathData,_void> *this,int frameNo,VPath *path)

{
  bool bVar1;
  const_reference pvVar2;
  reference this_00;
  int in_ESI;
  Property<rlottie::internal::model::PathData,_void> *in_RDI;
  Frame *keyFrame;
  const_iterator __end0;
  const_iterator __begin0;
  vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
  *__range5;
  vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
  *vec;
  VPath *in_stack_00000098;
  float in_stack_000000a4;
  PathData *in_stack_000000a8;
  PathData *in_stack_000000b0;
  Value<rlottie::internal::model::PathData,_void> *in_stack_ffffffffffffffa8;
  PathData *in_stack_ffffffffffffffb0;
  VPath *in_stack_ffffffffffffffc8;
  __normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
  in_stack_ffffffffffffffd0;
  
  bVar1 = isStatic(in_RDI);
  if (bVar1) {
    value(in_RDI);
    PathData::toPath((PathData *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8);
  }
  else {
    animation((Property<rlottie::internal::model::PathData,_void> *)0x1652fd);
    pvVar2 = std::
             vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
             ::front((vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
                      *)in_stack_ffffffffffffffb0);
    if (pvVar2->start_ < (float)in_ESI) {
      pvVar2 = std::
               vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
               ::back((vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
                       *)in_stack_ffffffffffffffb0);
      if ((float)in_ESI < pvVar2->end_) {
        std::
        vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
        ::begin((vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
                 *)in_stack_ffffffffffffffa8);
        std::
        vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
        ::end((vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
               *)in_stack_ffffffffffffffa8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
                                   *)in_stack_ffffffffffffffb0,
                                  (__normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
                                   *)in_stack_ffffffffffffffa8), bVar1) {
          this_00 = __gnu_cxx::
                    __normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
                    ::operator*((__normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
                                 *)&stack0xffffffffffffffd0);
          if ((this_00->start_ <= (float)in_ESI) && ((float)in_ESI < this_00->end_)) {
            in_stack_ffffffffffffffa8 = &this_00->value_;
            in_stack_ffffffffffffffb0 = &(this_00->value_).end_;
            KeyFrames<rlottie::internal::model::PathData,_void>::Frame::progress
                      (this_00,(int)((ulong)in_RDI >> 0x20));
            PathData::lerp(in_stack_000000b0,in_stack_000000a8,in_stack_000000a4,in_stack_00000098);
          }
          __gnu_cxx::
          __normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
          ::operator++((__normal_iterator<const_rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame_*,_std::vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>_>
                        *)&stack0xffffffffffffffd0);
        }
      }
      else {
        std::
        vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
        ::back((vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
                *)in_stack_ffffffffffffffb0);
        PathData::toPath((PathData *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8)
        ;
      }
    }
    else {
      std::
      vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
      ::front((vector<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<rlottie::internal::model::PathData,_void>::Frame>_>
               *)in_stack_ffffffffffffffb0);
      PathData::toPath((PathData *)in_stack_ffffffffffffffd0._M_current,in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

auto value(int frameNo, VPath &path) const ->
        typename std::enable_if_t<std::is_same<T, forT>::value, void>
    {
        if (isStatic()) {
            value().toPath(path);
        } else {
            const auto &vec = animation().frames_;
            if (vec.front().start_ >= frameNo)
                return vec.front().value_.start_.toPath(path);
            if (vec.back().end_ <= frameNo)
                return vec.back().value_.end_.toPath(path);

            for (const auto &keyFrame : vec) {
                if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_) {
                    T::lerp(keyFrame.value_.start_, keyFrame.value_.end_,
                            keyFrame.progress(frameNo), path);
                }
            }
        }
    }